

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makewff.c
# Opt level: O0

void generate_wff(void)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int dup;
  int lit;
  int cl [1000];
  int k;
  int j;
  int i;
  uint local_fb8 [1003];
  int local_c;
  uint local_8;
  int local_4;
  
  if (style == 0) {
    printf("c seed= %u\np cnf %d %d\n",(ulong)seed,(ulong)(uint)nvars,(ulong)(uint)nclauses);
  }
  else if (style == 2) {
    printf("%d %d\n",(ulong)(uint)nvars,(ulong)(uint)nclauses);
  }
  for (local_4 = 1; local_4 <= nclauses; local_4 = local_4 + 1) {
    for (local_8 = 0; (int)local_8 < clen; local_8 = local_8 + 1) {
      do {
        lVar4 = random();
        uVar2 = (int)(lVar4 % (long)nvars) + 1;
        bVar1 = false;
        for (local_c = 0; local_c < (int)local_8; local_c = local_c + 1) {
          if (uVar2 == local_fb8[local_c]) {
            bVar1 = true;
          }
        }
      } while (bVar1);
      local_fb8[(int)local_8] = uVar2;
    }
    for (local_8 = 0; (int)local_8 < clen; local_8 = local_8 + 1) {
      iVar3 = flip();
      if (iVar3 != 0) {
        local_fb8[(int)local_8] = -local_fb8[(int)local_8];
      }
    }
    if (style == 0) {
      for (local_8 = 0; (int)local_8 < clen; local_8 = local_8 + 1) {
        printf("%d ",(ulong)local_fb8[(int)local_8]);
      }
      printf("0\n");
    }
    else if (style == 1) {
      printf("%d",(ulong)local_fb8[0]);
      for (local_8 = 1; (int)local_8 < clen; local_8 = local_8 + 1) {
        printf(" %d",(ulong)local_fb8[(int)local_8]);
      }
      printf("\n");
    }
    else if (style == 2) {
      printf("%d",(ulong)local_8);
      for (local_8 = 0; (int)local_8 < clen; local_8 = local_8 + 1) {
        printf(" %d",(ulong)local_fb8[(int)local_8]);
      }
      printf("\n");
    }
  }
  if (style == 1) {
    printf("%%\n0\n");
  }
  return;
}

Assistant:

void generate_wff()
{
    int i, j, k;
    int cl[MAX_CLEN];
    int lit;
    int dup;

    if (style == CNF_style) {
        printf("c seed= %u\np cnf %d %d\n", seed, nvars, nclauses);
    } else if (style == KF_style) {
        printf("%d %d\n", nvars, nclauses);
    }

    for (i = 1; i <= nclauses; i++) {
        for (j = 0; j < clen; j++) {
            do {
                lit = random() % nvars + 1;
                dup = FALSE;
                for (k = 0; k < j; k++)
                    if (lit == cl[k])
                        dup = TRUE;
            } while (dup);
            cl[j] = lit;
        }
        for (j = 0; j < clen; j++)
            if (flip())
                cl[j] *= -1;

        if (style == CNF_style) {
            for (j = 0; j < clen; j++)
                printf("%d ", cl[j]);
            printf("0\n");
        } else if (style == F_style) {
            printf("%d", cl[0]);
            for (j = 1; j < clen; j++)
                printf(" %d", cl[j]);
            printf("\n");
        } else if (style == KF_style) {
            printf("%d", j);
            for (j = 0; j < clen; j++)
                printf(" %d", cl[j]);
            printf("\n");
        }
    }

    if (style == F_style) {
        printf("%%\n0\n");
    }
}